

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall
CTPNConst::gen_code_new
          (CTPNConst *this,int discard,int argc,int varargs,CTcNamedArgs *named_args,int param_5,
          int is_transient)

{
  if ((this->super_CTPNConstBase).val_.typ_ == TC_CVT_OBJ) {
    CTcSymObj::s_gen_code_new
              (discard,(this->super_CTPNConstBase).val_.val_.propval_,
               (this->super_CTPNConstBase).val_.val_.objval_.meta_,argc,varargs,named_args,
               is_transient);
    return;
  }
  CTcTokenizer::log_error(0x2cf8);
  return;
}

Assistant:

void CTPNConst::gen_code_new(int discard,
                             int argc, int varargs, CTcNamedArgs *named_args,
                             int /*from_call*/, int is_transient)
{
    /* check the type */
    switch(val_.get_type())
    {
    case TC_CVT_OBJ:
        /* 
         *   Treat this the same as any other 'new' call.  An object symbol
         *   folded into a constant is guaranteed to be of metaclass
         *   TadsObject - that's the only kind of symbol we'll ever fold this
         *   way. 
         */
        CTcSymObj::s_gen_code_new(discard,
                                  val_.get_val_obj(), val_.get_val_obj_meta(),
                                  argc, varargs, named_args, is_transient);
        break;

    default:
        /* can't apply 'new' to other constant values */
        G_tok->log_error(TCERR_INVAL_NEW_EXPR);
        break;
    }
}